

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O0

CellRelation __thiscall S2ShapeIndex::Iterator::Locate(Iterator *this,S2CellId target)

{
  CellRelation CVar1;
  Iterator *this_local;
  S2CellId target_local;
  
  CVar1 = IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(target,this);
  return CVar1;
}

Assistant:

CellRelation Locate(S2CellId target) {
      return IteratorBase::LocateImpl(target, this);
    }